

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Temp * __thiscall IR::IRBuilder::newTemp(IRBuilder *this,string *type)

{
  uint uVar1;
  Temp *pTVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  ulong local_58 [2];
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)type);
  uVar1 = this->function_->uniqueTempCount_;
  local_58[0] = (ulong)uVar1;
  this->function_->uniqueTempCount_ = uVar1 + 1;
  bVar3 = fmt::v7::to_string_view<char,_0>("yy{}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 2;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  .desc_ = (unsigned_long_long)local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)bVar3.data_,format_str,args);
  pTVar2 = getTemp(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return pTVar2;
}

Assistant:

const Temp* IRBuilder::newTemp(std::string type) {
  return getTemp(std::move(type),
                 fmt::format("yy{}", function_->uniqueTempCount_++));
}